

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::createReferenceProgram
          (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           *__return_storage_ptr__,SeparateShaderTest *this,ProgramParams *pp)

{
  ostringstream *this_00;
  bool uniform;
  deUint32 dVar1;
  ProgramWrapper *program;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *pMVar2;
  string frgSrc;
  string vtxSrc;
  allocator<char> local_1f9;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *local_1f8;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  uniform = (this->m_params).useUniform;
  dVar1 = pp->vtxSeed;
  varyingCompatVtxOutputs
            ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
             &local_1f0,&this->m_varyings);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,"vtxScale",&local_1f9);
  genVtxShaderSrc(&local_1d0,dVar1,
                  (vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
                  &local_1f0,(string *)local_1b0,uniform,pp->vtxScale);
  std::__cxx11::string::~string((string *)local_1b0);
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::~vector
            ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
             &local_1f0);
  dVar1 = pp->frgSeed;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,"frgScale",&local_1f9);
  genFrgShaderSrc(&local_1f0,dVar1,&(this->m_varyings).frgInputs,(string *)local_1b0,uniform,
                  pp->frgScale);
  std::__cxx11::string::~string((string *)local_1b0);
  createShaderProgram(__return_storage_ptr__,this,&local_1d0,&local_1f0,false);
  program = (__return_storage_ptr__->
            super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
            ).m_data.ptr;
  local_1f8 = __return_storage_ptr__;
  (*program->_vptr_ProgramWrapper[2])(program);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"// Created monolithic shader program ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  pMVar2 = local_1f8;
  if (uniform != false) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,"vtxScale",&local_1f9);
    setUniform(this,program,(string *)local_1b0,pp->vtxScale,false);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,"frgScale",&local_1f9);
    setUniform(this,program,(string *)local_1b0,pp->frgScale,false);
    std::__cxx11::string::~string((string *)local_1b0);
  }
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  return pMVar2;
}

Assistant:

MovePtr<ProgramWrapper> SeparateShaderTest::createReferenceProgram (const ProgramParams& pp)
{
	bool					useUniform	= m_params.useUniform;
	const string			vtxSrc		= genVtxShaderSrc(pp.vtxSeed,
														  varyingCompatVtxOutputs(m_varyings),
														  "vtxScale", useUniform, pp.vtxScale);
	const string			frgSrc		= genFrgShaderSrc(pp.frgSeed, m_varyings.frgInputs,
														  "frgScale", useUniform, pp.frgScale);
	MovePtr<ProgramWrapper>	program		= createShaderProgram(&vtxSrc, &frgSrc, false);
	GLuint					progName	= program->getProgramName();

	log() << TestLog::Message
		  << "// Created monolithic shader program " << progName
		  << TestLog::EndMessage;

	if (useUniform)
	{
		setUniform(*program, "vtxScale", pp.vtxScale, false);
		setUniform(*program, "frgScale", pp.frgScale, false);
	}

	return program;
}